

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O2

int mbedtls_mpi_grow(mbedtls_mpi *X,size_t nblimbs)

{
  ushort uVar1;
  mbedtls_mpi_uint *__src;
  mbedtls_mpi_uint *__dest;
  int iVar2;
  size_t __n;
  
  iVar2 = -0x10;
  if (nblimbs < 0x2711) {
    uVar1 = X->n;
    if (uVar1 < nblimbs) {
      __dest = (mbedtls_mpi_uint *)calloc(nblimbs,8);
      if (__dest == (mbedtls_mpi_uint *)0x0) {
        return -0x10;
      }
      __src = X->p;
      if (__src != (mbedtls_mpi_uint *)0x0) {
        __n = (ulong)uVar1 << 3;
        switchD_0193dc74::default(__dest,__src,__n);
        mbedtls_zeroize_and_free(__src,__n);
      }
      X->n = (unsigned_short)nblimbs;
      X->p = __dest;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_grow(mbedtls_mpi *X, size_t nblimbs)
{
    mbedtls_mpi_uint *p;

    if (nblimbs > MBEDTLS_MPI_MAX_LIMBS) {
        return MBEDTLS_ERR_MPI_ALLOC_FAILED;
    }

    if (X->n < nblimbs) {
        if ((p = (mbedtls_mpi_uint *) mbedtls_calloc(nblimbs, ciL)) == NULL) {
            return MBEDTLS_ERR_MPI_ALLOC_FAILED;
        }

        if (X->p != NULL) {
            memcpy(p, X->p, X->n * ciL);
            mbedtls_mpi_zeroize_and_free(X->p, X->n);
        }

        /* nblimbs fits in n because we ensure that MBEDTLS_MPI_MAX_LIMBS
         * fits, and we've checked that nblimbs <= MBEDTLS_MPI_MAX_LIMBS. */
        X->n = (unsigned short) nblimbs;
        X->p = p;
    }

    return 0;
}